

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O0

int adios2::TypeElementSize(DataType adiosvartype)

{
  DataType adiosvartype_local;
  int local_4;
  
  switch(adiosvartype) {
  case Int8:
    local_4 = 1;
    break;
  case Int16:
    local_4 = 2;
    break;
  case Int32:
    local_4 = 4;
    break;
  case Int64:
    local_4 = 8;
    break;
  case UInt8:
    local_4 = 1;
    break;
  case UInt16:
    local_4 = 2;
    break;
  case UInt32:
    local_4 = 4;
    break;
  case UInt64:
    local_4 = 8;
    break;
  case Float:
    local_4 = 4;
    break;
  case Double:
    local_4 = 8;
    break;
  case LongDouble:
    local_4 = 0x10;
    break;
  case FloatComplex:
    local_4 = 8;
    break;
  case DoubleComplex:
    local_4 = 0x10;
    break;
  case String:
    local_4 = -1;
    break;
  default:
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int TypeElementSize(DataType adiosvartype)
{
    switch (adiosvartype)
    {
    case DataType::UInt8:
        return 1;
    case DataType::Int8:
        return 1;
    case DataType::String:
        return -1;
    case DataType::UInt16:
        return 2;
    case DataType::Int16:
        return 2;
    case DataType::UInt32:
        return 4;
    case DataType::Int32:
        return 4;
    case DataType::UInt64:
        return 8;
    case DataType::Int64:
        return 8;
    case DataType::Float:
        return 4;
    case DataType::Double:
        return 8;
    case DataType::FloatComplex:
        return 8;
    case DataType::DoubleComplex:
        return 16;
    case DataType::LongDouble:
        return 16;
    default:
        return -1;
    }
}